

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void __thiscall MasterObjectHolder::deleteAll(MasterObjectHolder *this)

{
  _Elt_pointer puVar1;
  FedObject *pFVar2;
  Federate *this_00;
  _Elt_pointer puVar3;
  AppObject *app;
  _Elt_pointer puVar4;
  CoreObject *pCVar5;
  long *plVar6;
  _Elt_pointer puVar7;
  BrokerObject *pBVar8;
  handle *__range1;
  _Elt_pointer puVar9;
  _Elt_pointer puVar10;
  _Elt_pointer puVar11;
  _Elt_pointer puVar12;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  _Elt_pointer puVar13;
  _Elt_pointer puVar14;
  _Elt_pointer puVar15;
  _Elt_pointer puVar16;
  _Map_pointer ppuVar17;
  _Map_pointer ppuVar18;
  _Map_pointer ppuVar19;
  _Map_pointer ppuVar20;
  handle fedHandle;
  unique_lock<std::mutex> local_40;
  
  if (((((this->tripDetect).lineDetector.
         super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_base).
       _M_i & 1U) == 0) {
    local_40._M_device = &(this->feds).m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    puVar13 = (this->feds).m_obj.
              super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar1 = (this->feds).m_obj.
             super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar13 != puVar1) {
      puVar9 = (this->feds).m_obj.
               super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppuVar17 = (this->feds).m_obj.
                 super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        pFVar2 = (puVar13->_M_t).
                 super___uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>
                 .super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl;
        if ((pFVar2 != (FedObject *)0x0) &&
           (this_00 = (pFVar2->fedptr).
                      super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           this_00 != (Federate *)0x0)) {
          pFVar2->valid = 0;
          helics::Federate::finalize(this_00);
        }
        puVar13 = puVar13 + 1;
        if (puVar13 == puVar9) {
          puVar13 = ppuVar17[1];
          ppuVar17 = ppuVar17 + 1;
          puVar9 = puVar13 + 0x40;
        }
      } while (puVar13 != puVar1);
    }
    std::
    deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
    ::clear(&(this->feds).m_obj);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    local_40._M_device = &(this->apps).m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    puVar14 = (this->apps).m_obj.
              super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar3 = (this->apps).m_obj.
             super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar14 != puVar3) {
      puVar10 = (this->apps).m_obj.
                super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppuVar18 = (this->apps).m_obj.
                 super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        app = (puVar14->_M_t).
              super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t
              .super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
              super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl;
        if ((app != (AppObject *)0x0) &&
           ((app->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0)) {
          helicsAppFinalize(app,(HelicsError *)0x0);
          ((puVar14->_M_t).
           super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
           super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
           super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl)->valid = 0;
        }
        puVar14 = puVar14 + 1;
        if (puVar14 == puVar10) {
          puVar14 = ppuVar18[1];
          ppuVar18 = ppuVar18 + 1;
          puVar10 = puVar14 + 0x40;
        }
      } while (puVar14 != puVar3);
    }
    std::
    deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
    ::clear(&(this->apps).m_obj);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    local_40._M_device = &(this->cores).m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    puVar15 = (this->cores).m_obj.
              super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar4 = (this->cores).m_obj.
             super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar15 != puVar4) {
      puVar11 = (this->cores).m_obj.
                super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppuVar19 = (this->cores).m_obj.
                 super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        pCVar5 = (puVar15->_M_t).
                 super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>
                 .super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl;
        if ((pCVar5 != (CoreObject *)0x0) &&
           (plVar6 = *(long **)&(pCVar5->coreptr).
                                super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
           plVar6 != (long *)0x0)) {
          pCVar5->valid = 0;
          (**(code **)(*plVar6 + 0x40))();
        }
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar11) {
          puVar15 = ppuVar19[1];
          ppuVar19 = ppuVar19 + 1;
          puVar11 = puVar15 + 0x40;
        }
      } while (puVar15 != puVar4);
    }
    std::
    deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
    ::clear(&(this->cores).m_obj);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    local_40._M_device = &(this->brokers).m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    puVar16 = (this->brokers).m_obj.
              super__Deque_base<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar7 = (this->brokers).m_obj.
             super__Deque_base<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar16 != puVar7) {
      puVar12 = (this->brokers).m_obj.
                super__Deque_base<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppuVar20 = (this->brokers).m_obj.
                 super__Deque_base<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        pBVar8 = (puVar16->_M_t).
                 super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                 .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
        if ((pBVar8 != (BrokerObject *)0x0) &&
           (plVar6 = *(long **)&(pBVar8->brokerptr).
                                super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
           plVar6 != (long *)0x0)) {
          pBVar8->valid = 0;
          (**(code **)(*plVar6 + 0x18))();
        }
        puVar16 = puVar16 + 1;
        if (puVar16 == puVar12) {
          puVar16 = ppuVar20[1];
          ppuVar20 = ppuVar20 + 1;
          puVar12 = puVar16 + 0x40;
        }
      } while (puVar16 != puVar7);
    }
    std::
    deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
             *)this);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    local_40._M_device = &(this->errorStrings).m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->errorStrings).m_obj);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  return;
}

Assistant:

void helicsQuerySetQueryString(HelicsQuery query, const char* queryString, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    queryObj->query = AS_STRING(queryString);
}